

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToCenturiesOperator::Operation<int,duckdb::interval_t>(int input)

{
  interval_t iVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 in_EDI;
  int iinput;
  interval_t result;
  int in_stack_ffffffffffffffb4;
  allocator local_39;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffff0;
  undefined4 uVar5;
  
  iVar3 = Cast::Operation<int,int>(in_stack_ffffffffffffffb4);
  uVar5 = 0;
  bVar2 = duckdb::TryMultiplyOperator::Operation<int,int,int>
                    (iVar3,0x4b0,(int *)&stack0xfffffffffffffff0);
  if (!bVar2) {
    uVar4 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Interval value %s centuries out of range",&local_39);
    NumericHelper::ToString<int>((int)((ulong)uVar4 >> 0x20));
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              ((OutOfRangeException *)CONCAT44(uVar5,in_stack_fffffffffffffff0),
               (string *)CONCAT44(in_EDI,iVar3),in_stack_ffffffffffffffe0);
    __cxa_throw(uVar4,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  iVar1.days = uVar5;
  iVar1.months = in_stack_fffffffffffffff0;
  iVar1.micros = 0;
  return iVar1;
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_CENTURY,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %s centuries out of range", NumericHelper::ToString(input));
		}
		return result;
	}